

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int tx_elements_output_proof_init
              (wally_tx_output *output,uchar *surjectionproof,size_t surjectionproof_len,
              uchar *rangeproof,size_t rangeproof_len)

{
  int iVar1;
  uchar *__dest;
  uchar *__dest_00;
  bool bVar2;
  
  iVar1 = -2;
  if (((surjectionproof != (uchar *)0x0) != (surjectionproof_len == 0)) &&
     ((rangeproof != (uchar *)0x0) != (rangeproof_len == 0))) {
    if (surjectionproof_len == 0) {
      bVar2 = true;
      __dest = (uchar *)0x0;
    }
    else {
      __dest = (uchar *)wally_malloc(surjectionproof_len);
      if (__dest != (uchar *)0x0) {
        memcpy(__dest,surjectionproof,surjectionproof_len);
      }
      bVar2 = __dest != (uchar *)0x0;
    }
    if (bVar2) {
      if (rangeproof_len == 0) {
        bVar2 = true;
        __dest_00 = (uchar *)0x0;
      }
      else {
        __dest_00 = (uchar *)wally_malloc(rangeproof_len);
        if (__dest_00 != (uchar *)0x0) {
          memcpy(__dest_00,rangeproof,rangeproof_len);
        }
        bVar2 = __dest_00 != (uchar *)0x0;
      }
      if (bVar2) {
        output->surjectionproof = __dest;
        output->surjectionproof_len = surjectionproof_len;
        output->rangeproof = __dest_00;
        output->rangeproof_len = rangeproof_len;
        return 0;
      }
    }
    else {
      __dest_00 = (uchar *)0x0;
    }
    clear_and_free(__dest,surjectionproof_len);
    clear_and_free(__dest_00,rangeproof_len);
    iVar1 = -3;
  }
  return iVar1;
}

Assistant:

static int tx_elements_output_proof_init(
    struct wally_tx_output *output,
    const unsigned char *surjectionproof,
    size_t surjectionproof_len,
    const unsigned char *rangeproof,
    size_t rangeproof_len)
{
#ifdef BUILD_ELEMENTS
    unsigned char *new_surjectionproof = NULL, *new_rangeproof = NULL;
#endif
    (void) output;

    if (BYTES_INVALID(surjectionproof, surjectionproof_len) ||
        BYTES_INVALID(rangeproof, rangeproof_len))
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if (!clone_bytes(&new_surjectionproof, surjectionproof, surjectionproof_len) ||
        !clone_bytes(&new_rangeproof, rangeproof, rangeproof_len)) {
        clear_and_free(new_surjectionproof,  surjectionproof_len);
        clear_and_free(new_rangeproof, rangeproof_len);
        return WALLY_ENOMEM;
    }

    output->surjectionproof = new_surjectionproof;
    output->surjectionproof_len = surjectionproof_len;
    output->rangeproof = new_rangeproof;
    output->rangeproof_len = rangeproof_len;
#endif
    return WALLY_OK;
}